

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

int __thiscall
helics::CoreBroker::connect(CoreBroker *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  string_view name;
  string_view string2;
  string_view string1;
  string_view string1_00;
  bool bVar1;
  BrokerState BVar2;
  __int_type_conflict _Var3;
  uint uVar4;
  pointer this_00;
  pointer this_01;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 uVar5;
  ActionMessage reg;
  bool res;
  undefined4 in_stack_fffffffffffffc88;
  BrokerState in_stack_fffffffffffffc8c;
  BrokerState in_stack_fffffffffffffc8e;
  undefined6 in_stack_fffffffffffffc90;
  undefined6 uVar6;
  BrokerState in_stack_fffffffffffffc96;
  undefined2 uVar7;
  BrokerBase *in_stack_fffffffffffffc98;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca8;
  action_t in_stack_fffffffffffffcac;
  string *psVar8;
  CoreBroker *in_stack_fffffffffffffcb0;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  int local_2f4;
  duration<long,std::ratio<1l,1000l>> local_2f0 [8];
  pointer local_2e8;
  pointer local_2e0;
  undefined1 local_2d8 [48];
  __sv_type local_2a8;
  undefined4 local_294;
  GlobalFederateId local_290;
  undefined4 local_28c;
  __sv_type local_288;
  __sv_type local_278;
  __sv_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  GlobalFederateId local_244;
  undefined1 local_240 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238 [2];
  undefined1 in_stack_fffffffffffffdeb;
  undefined4 in_stack_fffffffffffffdec;
  undefined8 in_stack_fffffffffffffdf0;
  string_view in_stack_fffffffffffffdf8;
  GlobalFederateId in_stack_fffffffffffffe0c;
  format_args in_stack_fffffffffffffef0;
  string_view in_stack_ffffffffffffff00;
  string_view in_stack_ffffffffffffff30;
  time_point local_b8;
  time_point local_b0;
  undefined8 local_a8;
  GlobalFederateId local_8c [4];
  bool local_79;
  string local_78;
  _Hash_node_base local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  pointer local_48;
  pointer pBStack_40;
  string *local_38;
  pointer local_30;
  pointer local_28;
  pointer pBStack_20;
  CoreBroker *local_18;
  string *local_10;
  __node_base local_8;
  
  local_8c._4_8_ = this;
  BVar2 = BrokerBase::getBrokerState((BrokerBase *)0x54a8f5);
  if (BVar2 < CONNECTED) {
    bVar1 = BrokerBase::transitionBrokerState
                      ((BrokerBase *)CONCAT26(in_stack_fffffffffffffc96,in_stack_fffffffffffffc90),
                       in_stack_fffffffffffffc8e,in_stack_fffffffffffffc8c);
    if (bVar1) {
      _Var3 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base<int> *)in_stack_fffffffffffffc98);
      if (8 < _Var3) {
        GlobalFederateId::GlobalFederateId(local_8c,(GlobalBrokerId)0x0);
        getIdentifier_abi_cxx11_(this);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT26(in_stack_fffffffffffffc96,in_stack_fffffffffffffc90));
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98);
        in_stack_fffffffffffffc88 = (undefined4)local_b0.__d.__r;
        in_stack_fffffffffffffc8c = local_b0.__d.__r._4_2_;
        in_stack_fffffffffffffc8e = local_b0.__d.__r._6_2_;
        in_stack_fffffffffffffc90 = (undefined6)local_a8;
        in_stack_fffffffffffffc96 = SUB82(local_a8,6);
        BrokerBase::sendToLogger
                  ((BrokerBase *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffe0c,
                   in_stack_fffffffffffffdec,in_stack_fffffffffffffdf8,in_stack_ffffffffffffff30,
                   (bool)in_stack_fffffffffffffdeb);
      }
      this_00 = std::
                unique_ptr<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>::
                operator->((unique_ptr<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>
                            *)0x54a9f2);
      std::chrono::duration<long,std::ratio<1l,1000l>>::
      duration<TimeRepresentation<count_time<9,long>>,void>
                ((duration<long,_std::ratio<1L,_1000L>_> *)
                 CONCAT26(in_stack_fffffffffffffc96,in_stack_fffffffffffffc90),
                 (TimeRepresentation<count_time<9,_long>_> *)
                 CONCAT26(in_stack_fffffffffffffc8e,
                          CONCAT24(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88)));
      TimeoutMonitor::setTimeout(this_00,(milliseconds)local_b8.__d.__r);
      uVar4 = (*(this->super_Broker)._vptr_Broker[0x20])();
      local_79 = (bool)((byte)uVar4 & 1);
      if ((uVar4 & 1) == 0) {
        BrokerBase::setBrokerState(in_stack_fffffffffffffc98,in_stack_fffffffffffffc96);
        uVar5 = extraout_var_01;
      }
      else {
        gmlc::concurrency::TriggerVariable::activate((TriggerVariable *)in_stack_fffffffffffffc98);
        BrokerBase::setBrokerState(in_stack_fffffffffffffc98,in_stack_fffffffffffffc96);
        ActionMessage::ActionMessage
                  ((ActionMessage *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
        BrokerBase::addActionMessage
                  ((BrokerBase *)CONCAT26(in_stack_fffffffffffffc96,in_stack_fffffffffffffc90),
                   (ActionMessage *)
                   CONCAT26(in_stack_fffffffffffffc8e,
                            CONCAT24(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88)));
        ActionMessage::~ActionMessage
                  ((ActionMessage *)CONCAT26(in_stack_fffffffffffffc96,in_stack_fffffffffffffc90));
        bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffc98);
        if (!bVar1) {
          ActionMessage::ActionMessage
                    ((ActionMessage *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
          local_244.gid = 0;
          GlobalFederateId::GlobalFederateId(&local_244);
          local_238[0]._M_allocated_capacity._0_4_ = local_244.gid;
          getIdentifier_abi_cxx11_(this);
          local_258 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       )std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT26(in_stack_fffffffffffffc96,in_stack_fffffffffffffc90))
          ;
          name._M_len._4_2_ = in_stack_fffffffffffffc8c;
          name._M_len._0_4_ = in_stack_fffffffffffffc88;
          name._M_len._6_2_ = in_stack_fffffffffffffc8e;
          name._M_str._0_6_ = in_stack_fffffffffffffc90;
          name._M_str._6_2_ = in_stack_fffffffffffffc96;
          ActionMessage::name((ActionMessage *)0x54ab3f,name);
          if (((this->super_BrokerBase).no_ping & 1U) != 0) {
            setActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                      ((ActionMessage *)local_240,slow_responding_flag);
          }
          if (((this->super_BrokerBase).useJsonSerialization & 1U) != 0) {
            setActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                      ((ActionMessage *)local_240,use_json_serialization_flag);
          }
          bVar1 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x54abea);
          if ((bVar1) ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT26(in_stack_fffffffffffffc96,
                                                  in_stack_fffffffffffffc90),
                                      (char *)CONCAT26(in_stack_fffffffffffffc8e,
                                                       CONCAT24(in_stack_fffffffffffffc8c,
                                                                in_stack_fffffffffffffc88))),
             ((bVar1 ^ 0xffU) & 1) == 0)) {
            getAddress_abi_cxx11_(in_stack_fffffffffffffcb0);
            local_288 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT26(in_stack_fffffffffffffc96,in_stack_fffffffffffffc90))
            ;
            string1._M_str = (char *)in_stack_fffffffffffffca0;
            string1._M_len = (size_t)in_stack_fffffffffffffc98;
            ActionMessage::setStringData
                      ((ActionMessage *)
                       CONCAT26(in_stack_fffffffffffffc96,in_stack_fffffffffffffc90),string1);
          }
          else {
            getAddress_abi_cxx11_(in_stack_fffffffffffffcb0);
            local_268 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT26(in_stack_fffffffffffffc96,in_stack_fffffffffffffc90))
            ;
            local_278 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT26(in_stack_fffffffffffffc96,in_stack_fffffffffffffc90))
            ;
            string1_00._M_len._4_4_ = in_stack_fffffffffffffcac;
            string1_00._M_len._0_4_ = in_stack_fffffffffffffca8;
            string1_00._M_str = (char *)in_stack_fffffffffffffcb0;
            string2._M_str = (char *)in_stack_fffffffffffffca0;
            string2._M_len = (size_t)in_stack_fffffffffffffc98;
            ActionMessage::setStringData
                      ((ActionMessage *)
                       CONCAT26(in_stack_fffffffffffffc96,in_stack_fffffffffffffc90),string1_00,
                       string2);
          }
          local_28c = 0;
          (*(this->super_Broker)._vptr_Broker[0x22])(this,0,local_240);
          ActionMessage::~ActionMessage
                    ((ActionMessage *)CONCAT26(in_stack_fffffffffffffc96,in_stack_fffffffffffffc90))
          ;
        }
        _Var3 = std::__atomic_base::operator_cast_to_int
                          ((__atomic_base<int> *)in_stack_fffffffffffffc98);
        psVar8 = (string *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8);
        if (5 < _Var3) {
          local_294 = 0;
          GlobalFederateId::GlobalFederateId(&local_290,(GlobalBrokerId)0x0);
          getIdentifier_abi_cxx11_(this);
          local_2a8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT26(in_stack_fffffffffffffc96,in_stack_fffffffffffffc90));
          local_2e8 = (pointer)0x756b4f;
          local_2e0 = (pointer)0x19;
          this_01 = (pointer)getIdentifier_abi_cxx11_(this);
          local_38 = getAddress_abi_cxx11_(in_stack_fffffffffffffcb0);
          in_stack_fffffffffffffcb0 = (CoreBroker *)local_2d8;
          local_28 = local_2e8;
          pBStack_20 = local_2e0;
          local_48 = local_2e8;
          pBStack_40 = local_2e0;
          psVar8 = &local_78;
          local_30 = this_01;
          local_18 = in_stack_fffffffffffffcb0;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)this_01,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc98);
          local_10 = psVar8;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)this_01,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc98);
          local_8._M_nxt = &local_58;
          local_58._M_nxt = (_Hash_node_base *)0xdd;
          psVar8 = local_10;
          local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_10;
          ::fmt::v11::vformat_abi_cxx11_(in_stack_ffffffffffffff00,in_stack_fffffffffffffef0);
          local_2d8._32_16_ =
               (undefined1  [16])
               std::__cxx11::string::operator_cast_to_basic_string_view
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT26(in_stack_fffffffffffffc96,in_stack_fffffffffffffc90));
          uVar6 = local_2d8._40_6_;
          uVar7 = local_2d8._46_2_;
          BrokerBase::sendToLogger
                    ((BrokerBase *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffe0c,
                     in_stack_fffffffffffffdec,in_stack_fffffffffffffdf8,in_stack_ffffffffffffff30,
                     (bool)in_stack_fffffffffffffdeb);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT26(uVar7,uVar6));
        }
        bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x54af45);
        uVar5 = extraout_var;
        if (!bVar1) {
          makeConnections(in_stack_fffffffffffffcb0,psVar8);
          uVar5 = extraout_var_00;
        }
      }
      goto LAB_0054aff8;
    }
    BVar2 = BrokerBase::getBrokerState((BrokerBase *)0x54af96);
    if (BVar2 == CONNECTING) {
      while (BVar2 = BrokerBase::getBrokerState((BrokerBase *)0x54afac), BVar2 == CONNECTING) {
        local_2f4 = 0x14;
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_2f0,&local_2f4);
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)
                   CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
      }
    }
  }
  local_79 = isConnected((CoreBroker *)CONCAT26(in_stack_fffffffffffffc96,in_stack_fffffffffffffc90)
                        );
  uVar5 = extraout_var_02;
LAB_0054aff8:
  return (int)CONCAT71(uVar5,local_79);
}

Assistant:

bool CoreBroker::connect()
{
    if (getBrokerState() < BrokerState::CONNECTED) {
        if (transitionBrokerState(BrokerState::CONFIGURED, BrokerState::CONNECTING)) {
            LOG_CONNECTIONS(parent_broker_id, getIdentifier(), "connecting");
            timeoutMon->setTimeout(std::chrono::milliseconds(timeout));
            auto res = brokerConnect();
            if (res) {
                disconnection.activate();
                setBrokerState(BrokerState::CONNECTED);
                addActionMessage(CMD_BROKER_SETUP);
                if (!_isRoot) {
                    ActionMessage reg(CMD_REG_BROKER);
                    reg.source_id = GlobalFederateId{};
                    reg.name(getIdentifier());
                    if (no_ping) {
                        setActionFlag(reg, slow_responding_flag);
                    }
                    if (useJsonSerialization) {
                        setActionFlag(reg, use_json_serialization_flag);
                    }
                    if (!brokerKey.empty() && brokerKey != universalKey) {
                        reg.setStringData(getAddress(), brokerKey);
                    } else {
                        reg.setStringData(getAddress());
                    }
                    transmit(parent_route_id, reg);
                }
                LOG_SUMMARY(parent_broker_id,
                            getIdentifier(),
                            fmt::format("Broker {} connected on {}",
                                        getIdentifier(),
                                        getAddress()));
                if (!configString.empty()) {
                    makeConnections(configString);
                }
            } else {
                setBrokerState(BrokerState::CONFIGURED);
            }
            return res;
        }
        if (getBrokerState() == BrokerState::CONNECTING) {
            while (getBrokerState() == BrokerState::CONNECTING) {
                std::this_thread::sleep_for(std::chrono::milliseconds(20));
            }
        }
    }
    return isConnected();
}